

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_com.c
# Opt level: O1

MPP_RET hal_vp9d_output_probe(void *buf,void *dxva)

{
  RK_U64 *ptr;
  long lVar1;
  uint uVar2;
  undefined8 *puVar3;
  vp9_prob (*pavVar4) [9];
  vp9_prob (*paavVar5) [10] [9];
  ushort uVar6;
  ulong uVar7;
  undefined4 *puVar8;
  ulong uVar9;
  int iVar10;
  void *pvVar11;
  vp9_prob (*pavVar12) [9];
  uint uVar13;
  long lVar14;
  undefined1 *puVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  void *pvVar19;
  bool bVar20;
  byte bVar21;
  BitputCtx_t bp;
  vp9_prob partition_probs [16] [3];
  vp9_prob uv_mode_prob [10] [9];
  BitputCtx_t local_120;
  vp9_prob (*local_100) [9];
  vp9_prob (*local_f8) [9];
  void *local_f0;
  long local_e8;
  long local_e0;
  RK_U64 *local_d8;
  void *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98 [3];
  undefined1 local_7d [27];
  undefined1 local_62 [27];
  byte abStack_47 [7];
  undefined2 local_40;
  
  bVar21 = 0;
  uVar6 = *(ushort *)((long)dxva + 2) & 0x81;
  local_d0 = buf;
  memset(buf,0,0x980);
  if (uVar6 == 1) {
    local_c8 = *(undefined8 *)((long)dxva + 0x1d7);
    uStack_c0 = *(undefined8 *)((long)dxva + 0x1df);
    local_b8 = *(undefined8 *)((long)dxva + 0x1e7);
    uStack_b0 = *(undefined8 *)((long)dxva + 0x1ef);
    local_a8 = *(undefined8 *)((long)dxva + 0x1f7);
    uStack_a0 = *(undefined8 *)((long)dxva + 0x1ff);
    puVar8 = (undefined4 *)((long)dxva + 0xf4);
    puVar3 = local_98;
    for (lVar1 = 0x16; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined4 *)puVar3 = *puVar8;
      puVar8 = puVar8 + (ulong)bVar21 * -2 + 1;
      puVar3 = (undefined8 *)((long)puVar3 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_40 = *(undefined2 *)((long)dxva + 0x14c);
  }
  else {
    local_a8._0_1_ = '\v';
    local_a8._1_1_ = '\x18';
    local_a8._2_1_ = '\a';
    local_a8._3_1_ = '\x05';
    local_a8._4_1_ = 0xae;
    local_a8._5_1_ = '#';
    local_a8._6_1_ = '1';
    local_a8._7_1_ = 'D';
    uStack_a0._0_1_ = '\v';
    uStack_a0._1_1_ = '\x1b';
    uStack_a0._2_1_ = '9';
    uStack_a0._3_1_ = '\x0f';
    uStack_a0._4_1_ = '\t';
    uStack_a0._5_1_ = '\f';
    uStack_a0._6_1_ = '\x03';
    uStack_a0._7_1_ = '\x03';
    local_b8._0_1_ = '\x14';
    local_b8._1_1_ = '0';
    local_b8._2_1_ = 'S';
    local_b8._3_1_ = '5';
    local_b8._4_1_ = '\x18';
    local_b8._5_1_ = '4';
    local_b8._6_1_ = '\x12';
    local_b8._7_1_ = '\x12';
    uStack_b0._0_1_ = 0x96;
    uStack_b0._1_1_ = '(';
    uStack_b0._2_1_ = '\'';
    uStack_b0._3_1_ = 'N';
    uStack_b0._4_1_ = '\f';
    uStack_b0._5_1_ = '\x1a';
    uStack_b0._6_1_ = 'C';
    uStack_b0._7_1_ = '!';
    local_c8._0_1_ = 0x9e;
    local_c8._1_1_ = 'a';
    local_c8._2_1_ = '^';
    local_c8._3_1_ = ']';
    local_c8._4_1_ = '\x18';
    local_c8._5_1_ = 'c';
    local_c8._6_1_ = 'U';
    local_c8._7_1_ = 'w';
    uStack_c0._0_1_ = ',';
    uStack_c0._1_1_ = '>';
    uStack_c0._2_1_ = ';';
    uStack_c0._3_1_ = 'C';
    uStack_c0._4_1_ = 0x95;
    uStack_c0._5_1_ = '5';
    uStack_c0._6_1_ = '5';
    uStack_c0._7_1_ = '^';
    pavVar12 = vp9_kf_uv_mode_prob;
    puVar3 = local_98;
    for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *(undefined8 *)*pavVar12;
      pavVar12 = (vp9_prob (*) [9])((long)pavVar12 + ((ulong)bVar21 * -2 + 1) * 8);
      puVar3 = puVar3 + (ulong)bVar21 * -2 + 1;
    }
    local_40 = 0x803b;
  }
  local_d8 = (RK_U64 *)mpp_osal_calloc("hal_vp9d_output_probe",0x988);
  mpp_set_bitput_ctx(&local_120,local_d8,0x130);
  puVar3 = &local_c8;
  lVar1 = 0;
  do {
    lVar16 = -3;
    do {
      mpp_put_bits(&local_120,(ulong)*(byte *)((long)puVar3 + lVar16 + 3),8);
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0);
    lVar1 = lVar1 + 1;
    puVar3 = (undefined8 *)((long)puVar3 + 3);
  } while (lVar1 != 0x10);
  lVar1 = 0;
  do {
    mpp_put_bits(&local_120,(ulong)*(byte *)((long)dxva + lVar1 + 0x76),8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    mpp_put_bits(&local_120,(ulong)*(byte *)((long)dxva + lVar1 + 0x6f),8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  lVar1 = 0;
  do {
    mpp_put_bits(&local_120,(ulong)*(byte *)((long)dxva + lVar1 + 399),8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = (long)dxva + 0x183;
  lVar16 = 0;
  do {
    lVar17 = 0;
    do {
      mpp_put_bits(&local_120,(ulong)*(byte *)(lVar1 + lVar17),8);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 3);
    lVar1 = lVar1 + 3;
    bVar20 = lVar16 == 0;
    lVar16 = lVar16 + 1;
  } while (bVar20);
  lVar1 = (long)dxva + 0x189;
  lVar16 = 0;
  do {
    lVar17 = 0;
    do {
      mpp_put_bits(&local_120,(ulong)*(byte *)(lVar1 + lVar17),8);
      lVar17 = lVar17 + 1;
    } while (lVar17 == 1);
    lVar1 = lVar1 + 2;
    bVar20 = lVar16 == 0;
    lVar16 = lVar16 + 1;
  } while (bVar20);
  lVar1 = 0;
  do {
    mpp_put_bits(&local_120,(ulong)*(byte *)((long)dxva + lVar1 + 0x18d),8);
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  lVar1 = 0;
  do {
    mpp_put_bits(&local_120,(ulong)*(byte *)((long)dxva + lVar1 + 0x16b),8);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  mpp_put_align(&local_120,0x80,0);
  if (uVar6 == 1) {
    lVar1 = (long)dxva + 0xd0;
    lVar16 = 0;
    do {
      lVar17 = 0;
      do {
        mpp_put_bits(&local_120,(ulong)*(byte *)(lVar1 + lVar17),8);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      lVar16 = lVar16 + 1;
      lVar1 = lVar1 + 9;
    } while (lVar16 != 4);
    lVar1 = 0;
    do {
      mpp_put_bits(&local_120,(ulong)*(byte *)((long)dxva + lVar1 + 0x16f),8);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 5);
    lVar1 = 0;
    do {
      mpp_put_bits(&local_120,(ulong)*(byte *)((long)dxva + lVar1 + 0x17e),8);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 5);
    lVar1 = (long)dxva + 0x174;
    lVar16 = 0;
    do {
      lVar17 = 0;
      do {
        mpp_put_bits(&local_120,(ulong)*(byte *)(lVar1 + lVar17),8);
        lVar17 = lVar17 + 1;
      } while (lVar17 == 1);
      lVar16 = lVar16 + 1;
      lVar1 = lVar1 + 2;
    } while (lVar16 != 5);
    lVar1 = (long)dxva + 0x156;
    lVar16 = 0;
    do {
      lVar17 = 0;
      do {
        mpp_put_bits(&local_120,(ulong)*(byte *)(lVar1 + lVar17),8);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar16 = lVar16 + 1;
      lVar1 = lVar1 + 3;
    } while (lVar16 != 7);
    lVar1 = (long)dxva + 0x14e;
    lVar16 = 0;
    do {
      lVar17 = 0;
      do {
        mpp_put_bits(&local_120,(ulong)*(byte *)(lVar1 + lVar17),8);
        lVar17 = lVar17 + 1;
      } while (lVar17 == 1);
      lVar16 = lVar16 + 1;
      lVar1 = lVar1 + 2;
    } while (lVar16 != 4);
    lVar16 = 0;
    mpp_put_align(&local_120,0x80,0);
    lVar1 = (long)dxva + 0x207;
    local_f0 = dxva;
    do {
      lVar17 = 0;
      local_f8 = (vp9_prob (*) [9])lVar16;
      local_e0 = lVar1;
      do {
        lVar16 = 0;
        iVar10 = 0;
        local_100 = (vp9_prob (*) [9])lVar1;
        local_e8 = lVar17;
        do {
          lVar14 = 0;
          lVar17 = lVar1;
          do {
            lVar18 = 0;
            do {
              mpp_put_bits(&local_120,(ulong)*(byte *)(lVar17 + lVar18),8);
              iVar10 = iVar10 + 1;
              if (iVar10 == 0x1b) {
                iVar10 = 0;
                mpp_put_align(&local_120,0x80,0);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
            lVar14 = lVar14 + 1;
            lVar17 = lVar17 + 3;
          } while (lVar14 != 6);
          lVar16 = lVar16 + 1;
          lVar1 = lVar1 + 0x12;
        } while (lVar16 != 6);
        mpp_put_align(&local_120,0x80,0);
        lVar17 = local_e8 + 1;
        lVar1 = (long)local_100 + 0xd8;
      } while (local_e8 == 0);
      lVar16 = (long)local_f8 + 1;
      lVar1 = local_e0 + 0x1b0;
    } while (lVar16 != 4);
    pavVar12 = (vp9_prob (*) [9])((long)local_f0 + 0x273);
    lVar1 = 0;
    do {
      lVar16 = 0;
      local_f8 = pavVar12;
      local_e0 = lVar1;
      do {
        lVar1 = 0;
        iVar10 = 0;
        local_100 = pavVar12;
        local_e8 = lVar16;
        do {
          lVar16 = 0;
          pavVar4 = pavVar12;
          do {
            lVar17 = 0;
            do {
              mpp_put_bits(&local_120,(ulong)(*pavVar4)[lVar17],8);
              iVar10 = iVar10 + 1;
              if (iVar10 == 0x1b) {
                iVar10 = 0;
                mpp_put_align(&local_120,0x80,0);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            lVar16 = lVar16 + 1;
            pavVar4 = (vp9_prob (*) [9])(*pavVar4 + 3);
          } while (lVar16 != 6);
          lVar1 = lVar1 + 1;
          pavVar12 = pavVar12 + 2;
        } while (lVar1 != 6);
        mpp_put_align(&local_120,0x80,0);
        pvVar11 = local_f0;
        lVar16 = local_e8 + 1;
        pavVar12 = local_100 + 0x18;
      } while (local_e8 == 0);
      lVar1 = local_e0 + 1;
      pavVar12 = local_f8 + 0x30;
    } while (lVar1 != 4);
    puVar3 = local_98;
    lVar1 = 0;
    do {
      lVar16 = -9;
      do {
        mpp_put_bits(&local_120,(ulong)*(byte *)((long)puVar3 + lVar16 + 9),8);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0);
      lVar1 = lVar1 + 1;
      puVar3 = (undefined8 *)((long)puVar3 + 9);
    } while (lVar1 != 3);
    mpp_put_align(&local_120,0x80,0);
    lVar1 = 3;
    puVar15 = local_7d;
    do {
      lVar16 = 0;
      do {
        mpp_put_bits(&local_120,(ulong)(byte)puVar15[lVar16],8);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 9);
      lVar1 = lVar1 + 1;
      puVar15 = puVar15 + 9;
    } while (lVar1 != 6);
    mpp_put_align(&local_120,0x80,0);
    lVar1 = 6;
    puVar15 = local_62;
    do {
      lVar16 = 0;
      do {
        mpp_put_bits(&local_120,(ulong)(byte)puVar15[lVar16],8);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 9);
      lVar1 = lVar1 + 1;
      puVar15 = puVar15 + 9;
    } while (lVar1 != 9);
    lVar1 = 0;
    mpp_put_align(&local_120,0x80,0);
    do {
      mpp_put_bits(&local_120,(ulong)abStack_47[lVar1],8);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
    lVar1 = 0;
    mpp_put_align(&local_120,0x80,0);
    mpp_put_bits(&local_120,0,8);
    mpp_put_align(&local_120,0x80,0);
    do {
      mpp_put_bits(&local_120,(ulong)*(byte *)((long)pvVar11 + lVar1 + 0x192),8);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    lVar1 = 0;
    do {
      mpp_put_bits(&local_120,(ulong)*(byte *)((long)pvVar11 + lVar1 + 0x195),8);
      lVar1 = lVar1 + 0x21;
    } while (lVar1 == 0x21);
    lVar1 = (long)pvVar11 + 0x196;
    lVar16 = 0;
    do {
      lVar17 = 0;
      do {
        mpp_put_bits(&local_120,(ulong)*(byte *)(lVar1 + lVar17),8);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 10);
      lVar1 = lVar1 + 0x21;
      bVar20 = lVar16 == 0;
      lVar16 = lVar16 + 1;
    } while (bVar20);
    lVar1 = 0;
    do {
      mpp_put_bits(&local_120,(ulong)*(byte *)((long)pvVar11 + lVar1 + 0x1a0),8);
      lVar1 = lVar1 + 0x21;
    } while (lVar1 == 0x21);
    lVar1 = (long)pvVar11 + 0x1a1;
    lVar16 = 0;
    do {
      lVar17 = 0;
      do {
        mpp_put_bits(&local_120,(ulong)*(byte *)(lVar1 + lVar17),8);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 10);
      lVar1 = lVar1 + 0x21;
      bVar20 = lVar16 == 0;
      lVar16 = lVar16 + 1;
    } while (bVar20);
    lVar1 = (long)pvVar11 + 0x1ab;
    lVar16 = 0;
    do {
      lVar17 = 0;
      lVar14 = lVar1;
      do {
        lVar18 = 0;
        do {
          mpp_put_bits(&local_120,(ulong)*(byte *)(lVar14 + lVar18),8);
          pvVar11 = local_f0;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        lVar14 = lVar14 + 3;
        bVar20 = lVar17 == 0;
        lVar17 = lVar17 + 1;
      } while (bVar20);
      lVar1 = lVar1 + 0x21;
      bVar20 = lVar16 == 0;
      lVar16 = lVar16 + 1;
    } while (bVar20);
    lVar1 = (long)local_f0 + 0x1b1;
    lVar16 = 0;
    do {
      lVar17 = 0;
      do {
        mpp_put_bits(&local_120,(ulong)*(byte *)(lVar1 + lVar17),8);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar1 = lVar1 + 0x21;
      bVar20 = lVar16 == 0;
      lVar16 = lVar16 + 1;
    } while (bVar20);
    lVar1 = 0;
    do {
      mpp_put_bits(&local_120,(ulong)*(byte *)((long)pvVar11 + lVar1 + 0x1b4),8);
      lVar1 = lVar1 + 0x21;
    } while (lVar1 == 0x21);
    lVar1 = 0;
    do {
      mpp_put_bits(&local_120,(ulong)*(byte *)((long)pvVar11 + lVar1 + 0x1b5),8);
      lVar1 = lVar1 + 0x21;
    } while (lVar1 == 0x21);
    mpp_put_align(&local_120,0x80,0);
  }
  else {
    pvVar11 = (void *)((long)dxva + 0x207);
    pavVar12 = (vp9_prob (*) [9])0x0;
    do {
      lVar1 = 0;
      local_f8 = pavVar12;
      local_f0 = pvVar11;
      do {
        lVar16 = 0;
        iVar10 = 0;
        local_100 = (vp9_prob (*) [9])pvVar11;
        local_e8 = lVar1;
        do {
          lVar1 = 0;
          pvVar19 = pvVar11;
          do {
            lVar17 = 0;
            do {
              mpp_put_bits(&local_120,(ulong)*(byte *)((long)pvVar19 + lVar17),8);
              iVar10 = iVar10 + 1;
              if (iVar10 == 0x1b) {
                iVar10 = 0;
                mpp_put_align(&local_120,0x80,0);
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            lVar1 = lVar1 + 1;
            pvVar19 = (void *)((long)pvVar19 + 3);
          } while (lVar1 != 6);
          lVar16 = lVar16 + 1;
          pvVar11 = (void *)((long)pvVar11 + 0x12);
        } while (lVar16 != 6);
        mpp_put_align(&local_120,0x80,0);
        lVar1 = local_e8 + 1;
        pvVar11 = (void *)((long)local_100 + 0xd8);
      } while (local_e8 == 0);
      pavVar12 = (vp9_prob (*) [9])(*local_f8 + 1);
      pvVar11 = (void *)((long)local_f0 + 0x1b0);
    } while (pavVar12 != (vp9_prob (*) [9])0x4);
    paavVar5 = vp9_kf_y_mode_prob;
    pavVar12 = vp9_kf_uv_mode_prob;
    uVar9 = 0;
    do {
      lVar1 = 0;
      iVar10 = 0;
      local_100 = *paavVar5;
      do {
        lVar16 = -9;
        do {
          mpp_put_bits(&local_120,(ulong)(*(vp9_prob (*) [9])((long)paavVar5 + 9))[lVar16],8);
          iVar10 = iVar10 + 1;
          if (iVar10 == 0x1b) {
            iVar10 = 0;
            mpp_put_align(&local_120,0x80,0);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0);
        lVar1 = lVar1 + 1;
        paavVar5 = (vp9_prob (*) [10] [9])((long)paavVar5 + 9);
      } while (lVar1 != 10);
      if (uVar9 < 4) {
        uVar13 = (uint)(uVar9 != 3) * 2 + 0x15;
        uVar2 = 0x16;
        if (0x16 < uVar13) {
          uVar2 = uVar13;
        }
        uVar7 = 0xffffffffffffffff;
        do {
          mpp_put_bits(&local_120,(ulong)*(vp9_prob *)((long)pavVar12 + uVar7 + 1),8);
          lVar1 = uVar7 - uVar13;
          uVar7 = uVar7 + 1;
        } while (lVar1 != -2);
        if (uVar7 < 0x16) {
          iVar10 = (uVar2 - uVar13) + 1;
          do {
            mpp_put_bits(&local_120,0,8);
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
      }
      else {
        iVar10 = 0x17;
        do {
          mpp_put_bits(&local_120,0,8);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      mpp_put_align(&local_120,0x80,0);
      uVar9 = uVar9 + 1;
      paavVar5 = (vp9_prob (*) [10] [9])(local_100 + 10);
      pavVar12 = (vp9_prob (*) [9])((long)pavVar12 + 0x17);
    } while (uVar9 != 10);
    iVar10 = 1;
    do {
      mpp_put_bits(&local_120,0,8);
      mpp_put_align(&local_120,0x80,0);
      iVar10 = iVar10 + -1;
    } while (iVar10 == 0);
  }
  ptr = local_d8;
  memcpy(local_d0,local_d8,0x980);
  if (ptr != (RK_U64 *)0x0) {
    mpp_osal_free("hal_vp9d_output_probe",ptr);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp9d_output_probe(void *buf, void *dxva)
{
    RK_S32 i, j, k, m, n;
    RK_S32 fifo_len = 304;
    RK_U64 *probe_packet = NULL;
    BitputCtx_t bp;
    DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)dxva;
    RK_S32 intraFlag = (!pic_param->frame_type || pic_param->intra_only);
    vp9_prob partition_probs[PARTITION_CONTEXTS][PARTITION_TYPES - 1];
    vp9_prob uv_mode_prob[INTRA_MODES][INTRA_MODES - 1];

    memset(buf, 0, 304 * 8);

    if (intraFlag) {
        memcpy(partition_probs, vp9_kf_partition_probs, sizeof(partition_probs));
        memcpy(uv_mode_prob, vp9_kf_uv_mode_prob, sizeof(uv_mode_prob));
    } else {
        memcpy(partition_probs, pic_param->prob.partition, sizeof(partition_probs));
        memcpy(uv_mode_prob, pic_param->prob.uv_mode, sizeof(uv_mode_prob));
    }

    probe_packet = mpp_calloc(RK_U64, fifo_len + 1);
    mpp_set_bitput_ctx(&bp, probe_packet, fifo_len);
    //sb info  5 x 128 bit
    for (i = 0; i < PARTITION_CONTEXTS; i++) //kf_partition_prob
        for (j = 0; j < PARTITION_TYPES - 1; j++)
            mpp_put_bits(&bp, partition_probs[i][j], 8); //48

    for (i = 0; i < PREDICTION_PROBS; i++) //Segment_id_pred_prob //3
        mpp_put_bits(&bp, pic_param->stVP9Segments.pred_probs[i], 8);

    for (i = 0; i < SEG_TREE_PROBS; i++) //Segment_id_probs
        mpp_put_bits(&bp, pic_param->stVP9Segments.tree_probs[i], 8); //7

    for (i = 0; i < SKIP_CONTEXTS; i++) //Skip_flag_probs //3
        mpp_put_bits(&bp, pic_param->prob.skip[i], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //6
        for (j = 0; j < TX_SIZES - 1; j++)
            mpp_put_bits(&bp, pic_param->prob.tx32p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //4
        for (j = 0; j < TX_SIZES - 2; j++)
            mpp_put_bits(&bp, pic_param->prob.tx16p[i][j], 8);

    for (i = 0; i < TX_SIZE_CONTEXTS; i++) //Tx_size_probs //2
        mpp_put_bits(&bp, pic_param->prob.tx8p[i], 8);

    for (i = 0; i < INTRA_INTER_CONTEXTS; i++) //Tx_size_probs //4
        mpp_put_bits(&bp, pic_param->prob.intra[i], 8);

    mpp_put_align(&bp, 128, 0);
    if (intraFlag) { //intra probs
        //intra only //149 x 128 bit ,aligned to 152 x 128 bit
        //coeff releated prob   64 x 128 bit
        for (i = 0; i < TX_SIZES; i++)
            for (j = 0; j < PLANE_TYPES; j++) {
                RK_S32 byte_count = 0;
                for (k = 0; k < COEF_BANDS; k++) {
                    for (m = 0; m < COEFF_CONTEXTS; m++)
                        for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                            mpp_put_bits(&bp, pic_param->prob.coef[i][j][0][k][m][n], 8);

                            byte_count++;
                            if (byte_count == 27) {
                                mpp_put_align(&bp, 128, 0);
                                byte_count = 0;
                            }
                        }
                }
                mpp_put_align(&bp, 128, 0);
            }

        //intra mode prob  80 x 128 bit
        for (i = 0; i < INTRA_MODES; i++) { //vp9_kf_y_mode_prob
            RK_S32 byte_count = 0;
            for (j = 0; j < INTRA_MODES; j++)
                for (k = 0; k < INTRA_MODES - 1; k++) {
                    mpp_put_bits(&bp, vp9_kf_y_mode_prob[i][j][k], 8);
                    byte_count++;
                    if (byte_count == 27) {
                        byte_count = 0;
                        mpp_put_align(&bp, 128, 0);
                    }

                }
            if (i < 4) {
                for (m = 0; m < (i < 3 ? 23 : 21); m++)
                    mpp_put_bits(&bp, ((vp9_prob *)(&vp9_kf_uv_mode_prob[0][0]))[i * 23 + m], 8);
                for (; m < 23; m++)
                    mpp_put_bits(&bp, 0, 8);
            } else {
                for (m = 0; m < 23; m++)
                    mpp_put_bits(&bp, 0, 8);
            }
            mpp_put_align(&bp, 128, 0);
        }
        //align to 152 x 128 bit
        for (i = 0; i < INTER_PROB_SIZE_ALIGN_TO_128 - INTRA_PROB_SIZE_ALIGN_TO_128; i++) { //aligned to 153 x 256 bit
            mpp_put_bits(&bp, 0, 8);
            mpp_put_align(&bp, 128, 0);
        }
    } else {
        //inter probs
        //151 x 128 bit ,aligned to 152 x 128 bit
        //inter only

        //intra_y_mode & inter_block info   6 x 128 bit
        for (i = 0; i < BLOCK_SIZE_GROUPS; i++) //intra_y_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.y_mode[i][j], 8);

        for (i = 0; i < COMP_INTER_CONTEXTS; i++) //reference_mode prob
            mpp_put_bits(&bp, pic_param->prob.comp[i], 8);

        for (i = 0; i < REF_CONTEXTS; i++) //comp ref bit
            mpp_put_bits(&bp, pic_param->prob.comp_ref[i], 8);

        for (i = 0; i < REF_CONTEXTS; i++) //single ref bit
            for (j = 0; j < 2; j++)
                mpp_put_bits(&bp, pic_param->prob.single_ref[i][j], 8);

        for (i = 0; i < INTER_MODE_CONTEXTS; i++) //mv mode bit
            for (j = 0; j < INTER_MODES - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_mode[i][j], 8);


        for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; i++) //comp ref bit
            for (j = 0; j < SWITCHABLE_FILTERS - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.filter[i][j], 8);

        mpp_put_align(&bp, 128, 0);

        //128 x 128bit
        //coeff releated
        for (i = 0; i < TX_SIZES; i++)
            for (j = 0; j < PLANE_TYPES; j++) {
                RK_S32 byte_count = 0;
                for (k = 0; k < COEF_BANDS; k++) {
                    for (m = 0; m < COEFF_CONTEXTS; m++)
                        for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                            mpp_put_bits(&bp, pic_param->prob.coef[i][j][0][k][m][n], 8);
                            byte_count++;
                            if (byte_count == 27) {
                                mpp_put_align(&bp, 128, 0);
                                byte_count = 0;
                            }
                        }
                }
                mpp_put_align(&bp, 128, 0);
            }
        for (i = 0; i < TX_SIZES; i++)
            for (j = 0; j < PLANE_TYPES; j++) {
                RK_S32 byte_count = 0;
                for (k = 0; k < COEF_BANDS; k++) {
                    for (m = 0; m < COEFF_CONTEXTS; m++) {
                        for (n = 0; n < UNCONSTRAINED_NODES; n++) {
                            mpp_put_bits(&bp, pic_param->prob.coef[i][j][1][k][m][n], 8);
                            byte_count++;
                            if (byte_count == 27) {
                                mpp_put_align(&bp, 128, 0);
                                byte_count = 0;
                            }
                        }

                    }
                }
                mpp_put_align(&bp, 128, 0);
            }

        //intra uv mode 6 x 128
        for (i = 0; i < 3; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);
        mpp_put_align(&bp, 128, 0);

        for (; i < 6; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);
        mpp_put_align(&bp, 128, 0);

        for (; i < 9; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);
        mpp_put_align(&bp, 128, 0);
        for (; i < INTRA_MODES; i++) //intra_uv_mode
            for (j = 0; j < INTRA_MODES - 1; j++)
                mpp_put_bits(&bp, uv_mode_prob[i][j], 8);

        mpp_put_align(&bp, 128, 0);
        mpp_put_bits(&bp, 0, 8);
        mpp_put_align(&bp, 128, 0);

        //mv releated 6 x 128
        for (i = 0; i < MV_JOINTS - 1; i++) //mv_joint_type
            mpp_put_bits(&bp, pic_param->prob.mv_joint[i], 8);

        for (i = 0; i < 2; i++) { //sign bit
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].sign, 8);
        }
        for (i = 0; i < 2; i++) { //classes bit
            for (j = 0; j < MV_CLASSES - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].classes[j], 8);
        }
        for (i = 0; i < 2; i++) { //classe0 bit
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0, 8);
        }
        for (i = 0; i < 2; i++) { // bits
            for (j = 0; j < MV_OFFSET_BITS; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].bits[j], 8);
        }
        for (i = 0; i < 2; i++) { //class0_fp bit
            for (j = 0; j < CLASS0_SIZE; j++)
                for (k = 0; k < MV_FP_SIZE - 1; k++)
                    mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_fp[j][k], 8);
        }
        for (i = 0; i < 2; i++) { //comp ref bit
            for (j = 0; j < MV_FP_SIZE - 1; j++)
                mpp_put_bits(&bp, pic_param->prob.mv_comp[i].fp[j], 8);
        }
        for (i = 0; i < 2; i++) { //class0_hp bit

            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].class0_hp, 8);
        }
        for (i = 0; i < 2; i++) { //hp bit
            mpp_put_bits(&bp, pic_param->prob.mv_comp[i].hp, 8);
        }
        mpp_put_align(&bp, 128, 0);
    }

    memcpy(buf, probe_packet, 304 * 8);

#ifdef dump
    if (intraFlag) {
        fwrite(probe_packet, 1, 302 * 8, vp9_fp);
    } else {
        fwrite(probe_packet, 1, 304 * 8, vp9_fp);
    }
    fflush(vp9_fp);
#endif
    MPP_FREE(probe_packet);

    return 0;
}